

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

secp256k1_aggsig_context *
secp256k1_aggsig_context_create
          (secp256k1_context *ctx,secp256k1_pubkey *pubkeys,size_t n_pubkeys,uchar *seed)

{
  secp256k1_aggsig_context *psVar1;
  nonce_progress *pnVar2;
  secp256k1_pubkey *psVar3;
  secp256k1_scalar *psVar4;
  secp256k1_callback *cb;
  
  cb = &ctx->error_callback;
  psVar1 = (secp256k1_aggsig_context *)checked_malloc(cb,0xe8);
  pnVar2 = (nonce_progress *)checked_malloc(cb,n_pubkeys * 4);
  psVar1->progress = pnVar2;
  psVar3 = (secp256k1_pubkey *)checked_malloc(cb,n_pubkeys << 6);
  psVar1->pubkeys = psVar3;
  psVar4 = (secp256k1_scalar *)checked_malloc(cb,n_pubkeys << 5);
  psVar1->secnonce = psVar4;
  psVar1->n_sigs = n_pubkeys;
  secp256k1_gej_set_infinity(&psVar1->pubnonce_sum);
  memcpy(psVar1->pubkeys,pubkeys,n_pubkeys << 6);
  memset(psVar1->progress,0,n_pubkeys * 4);
  secp256k1_rfc6979_hmac_sha256_initialize(&psVar1->rng,seed,0x20);
  return psVar1;
}

Assistant:

secp256k1_aggsig_context* secp256k1_aggsig_context_create(const secp256k1_context *ctx, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const unsigned char *seed) {
    secp256k1_aggsig_context* aggctx;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(seed != NULL);

    aggctx = (secp256k1_aggsig_context*)checked_malloc(&ctx->error_callback, sizeof(*aggctx));
    aggctx->progress = (enum nonce_progress*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->progress));
    aggctx->pubkeys = (secp256k1_pubkey*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->pubkeys));
    aggctx->secnonce = (secp256k1_scalar*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->secnonce));
    aggctx->n_sigs = n_pubkeys;
    secp256k1_gej_set_infinity(&aggctx->pubnonce_sum);
    memcpy(aggctx->pubkeys, pubkeys, n_pubkeys * sizeof(*aggctx->pubkeys));
    memset(aggctx->progress, 0, n_pubkeys * sizeof(*aggctx->progress));
    secp256k1_rfc6979_hmac_sha256_initialize(&aggctx->rng, seed, 32);
    return aggctx;
}